

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt32
          (OptionInterpreter *this,int number,int32 value,Type type,UnknownFieldSet *unknown_fields)

{
  LogMessage *this_00;
  int in_ECX;
  int32 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int number_00;
  LogMessage *unaff_retaddr;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  LogMessage *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 local_58 [84];
  int value_00;
  
  value_00 = (int)((ulong)in_RDI >> 0x20);
  number_00 = (int)((ulong)in_R8 >> 0x20);
  if (in_ECX == 5) {
    UnknownFieldSet::AddVarint
              ((UnknownFieldSet *)CONCAT44(5,in_stack_ffffffffffffff90),
               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(uint64)in_stack_ffffffffffffff80);
  }
  else if (in_ECX == 0xf) {
    UnknownFieldSet::AddFixed32
              ((UnknownFieldSet *)in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint32)in_stack_ffffffffffffff78);
  }
  else if (in_ECX == 0x11) {
    internal::WireFormatLite::ZigZagEncode32(in_EDX);
    UnknownFieldSet::AddVarint
              ((UnknownFieldSet *)CONCAT44(in_ECX,in_ESI),number_00,
               (uint64)in_stack_ffffffffffffff80);
  }
  else {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff80,(LogLevel_conflict)((ulong)local_58 >> 0x20),
               (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this_00 = internal::LogMessage::operator<<(unaff_retaddr,value_00);
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    internal::LogMessage::~LogMessage((LogMessage *)0x4b4a4f);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt32(
    int number, int32 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      unknown_fields->AddVarint(number,
                                static_cast<uint64>(static_cast<int64>(value)));
      break;

    case FieldDescriptor::TYPE_SFIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32>(value));
      break;

    case FieldDescriptor::TYPE_SINT32:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode32(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT32: " << type;
      break;
  }
}